

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

Half deqp::gls::roundTo<deqp::gls::GLValue::Half>(Half *step,Half *value)

{
  Half HVar1;
  Half local_22;
  Half *local_20;
  Half *value_local;
  Half *step_local;
  
  local_20 = value;
  value_local = step;
  local_22 = GLValue::Half::operator%(value,step);
  HVar1 = GLValue::Half::operator-(value,&local_22);
  return (Half)HVar1.m_value;
}

Assistant:

T roundTo (const T& step, const T& value)
{
	return value - (value % step);
}